

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_compressBlock_lazy_dedicatedDictSearch_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  ZSTD_matchState_t *pZVar2;
  U32 *pUVar3;
  char cVar4;
  undefined8 uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  size_t sVar10;
  ulong uVar11;
  byte bVar12;
  int iVar13;
  int iVar14;
  int *mEnd;
  BYTE *pBVar15;
  uint uVar16;
  int *piVar17;
  seqDef *psVar18;
  int *piVar19;
  ulong uVar20;
  BYTE *pBVar21;
  int *iEnd;
  int *piVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  long lVar26;
  size_t ofbCandidate;
  uint local_fc;
  size_t local_f8;
  uint local_ec;
  BYTE *local_e8;
  uint local_dc;
  ZSTD_matchState_t *local_d8;
  seqStore_t *local_d0;
  uint local_c8;
  uint local_c4;
  ulong local_c0;
  int *local_b8;
  int *local_b0;
  int *local_a8;
  BYTE *local_a0;
  BYTE *local_98;
  uint local_8c;
  uint *local_88;
  BYTE *local_80;
  int *local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  BYTE *local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_e8 = (ms->window).base;
  local_c8 = (ms->cParams).minMatch;
  if (5 < local_c8) {
    local_c8 = 6;
  }
  if (local_c8 < 5) {
    local_c8 = 4;
  }
  local_c4 = (ms->cParams).searchLog;
  local_ec = 6;
  if (local_c4 < 6) {
    local_ec = local_c4;
  }
  uVar8 = (ms->window).dictLimit;
  local_c0 = (ulong)uVar8;
  if (local_ec < 5) {
    local_ec = 4;
  }
  local_a0 = local_e8 + local_c0;
  pZVar2 = ms->dictMatchState;
  local_98 = (pZVar2->window).base;
  local_58 = local_98 + (pZVar2->window).dictLimit;
  local_a8 = (int *)(pZVar2->window).nextSrc;
  iVar13 = (int)local_a8;
  uVar7 = ((int)src - ((int)local_58 + (int)local_a0)) + iVar13;
  piVar19 = (int *)((long)src + (ulong)(uVar7 == 0));
  local_fc = *rep;
  local_d0 = seqStore;
  if (uVar7 < local_fc) {
    __assert_fail("offset_1 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7977,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  local_dc = rep[1];
  local_b0 = piVar19;
  local_88 = rep;
  if (uVar7 < local_dc) {
    __assert_fail("offset_2 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7978,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  local_b8 = (int *)((long)src + (srcSize - 0x10));
  ms->lazySkipping = 0;
  uVar7 = ms->nextToUpdate;
  uVar20 = (ulong)uVar7;
  uVar16 = ((int)local_b8 - (int)(local_e8 + uVar20)) + 1;
  uVar9 = 8;
  if (uVar16 < 8) {
    uVar9 = uVar16;
  }
  if (local_b8 < local_e8 + uVar20) {
    uVar9 = 0;
  }
  bVar12 = (byte)local_ec;
  local_d8 = ms;
  if (uVar7 < uVar9 + uVar7) {
    if (0x20 < ms->rowHashLog + 8) {
LAB_0017fbda:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4741,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
    }
    pUVar3 = ms->hashTable;
    pBVar21 = ms->tagTable;
    uVar11 = ms->hashSalt;
    cVar4 = (char)ms->rowHashLog;
    do {
      if (local_c8 == 5) {
        uVar23 = *(long *)(local_e8 + uVar20) * -0x30e4432345000000;
LAB_0017f079:
        uVar16 = (uint)((uVar23 ^ uVar11) >> (0x38U - cVar4 & 0x3f));
      }
      else {
        if (local_c8 == 6) {
          uVar23 = *(long *)(local_e8 + uVar20) * -0x30e4432340650000;
          goto LAB_0017f079;
        }
        uVar16 = (*(int *)(local_e8 + uVar20) * -0x61c8864f ^ (uint)uVar11) >>
                 (0x18U - cVar4 & 0x1f);
      }
      uVar25 = (uVar16 >> 8) << (bVar12 & 0x1f);
      if (((ulong)(pUVar3 + uVar25) & 0x3f) != 0) {
LAB_0017fb01:
        __assert_fail("ZSTD_isAligned(hashTable + relRow, 64)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x76a2,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      if (((ulong)(pBVar21 + uVar25) & ~(-1L << (bVar12 & 0x3f))) != 0) {
LAB_0017fae2:
        __assert_fail("ZSTD_isAligned(tagTable + relRow, (size_t)1 << rowLog)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x76a3,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      ms->hashCache[(uint)uVar20 & 7] = uVar16;
      uVar20 = uVar20 + 1;
    } while (uVar9 + uVar7 != uVar20);
  }
  iEnd = (int *)(srcSize + (long)src);
  if (piVar19 < local_b8) {
    local_8c = ((int)local_98 - iVar13) + uVar8;
    local_80 = local_98 + -(ulong)local_8c;
    local_78 = iEnd + -8;
    local_38 = ~(-1L << (bVar12 & 0x3f));
    iVar14 = (int)local_e8;
    local_60 = (ulong)((1 - uVar8) - iVar14);
    local_68 = (ulong)(uint)-iVar14;
    local_70 = (ulong)((((iVar13 - uVar8) - (int)local_98) - iVar14) + 1);
    do {
      uVar8 = (((int)piVar19 - (int)local_e8) - local_fc) + 1;
      piVar22 = (int *)(local_e8 + uVar8);
      if (uVar8 < (uint)local_c0) {
        piVar22 = (int *)(local_98 + (uVar8 - local_8c));
      }
      local_b0 = piVar19;
      if ((uVar8 - (uint)local_c0 < 0xfffffffd) && (*piVar22 == *(int *)((long)piVar19 + 1))) {
        piVar17 = iEnd;
        if (uVar8 < (uint)local_c0) {
          piVar17 = local_a8;
        }
        sVar10 = ZSTD_count_2segments
                           ((BYTE *)((long)piVar19 + 5),(BYTE *)(piVar22 + 1),(BYTE *)iEnd,
                            (BYTE *)piVar17,local_a0);
        uVar20 = sVar10 + 4;
      }
      else {
        uVar20 = 0;
      }
      local_f8 = 999999999;
      if (local_c8 == 6) {
        if (local_ec == 6) {
          uVar11 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_6
                             (ms,(BYTE *)local_b0,(BYTE *)iEnd,&local_f8);
        }
        else if (local_ec == 5) {
          uVar11 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_5
                             (ms,(BYTE *)local_b0,(BYTE *)iEnd,&local_f8);
        }
        else {
          uVar11 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_4
                             (ms,(BYTE *)local_b0,(BYTE *)iEnd,&local_f8);
        }
      }
      else if (local_c8 == 5) {
        if (local_ec == 6) {
          uVar11 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_6
                             (ms,(BYTE *)local_b0,(BYTE *)iEnd,&local_f8);
        }
        else if (local_ec == 5) {
          uVar11 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_5
                             (ms,(BYTE *)local_b0,(BYTE *)iEnd,&local_f8);
        }
        else {
          uVar11 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_4
                             (ms,(BYTE *)local_b0,(BYTE *)iEnd,&local_f8);
        }
      }
      else if (local_ec == 6) {
        uVar11 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_6
                           (ms,(BYTE *)local_b0,(BYTE *)iEnd,&local_f8);
      }
      else if (local_ec == 5) {
        uVar11 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_5
                           (ms,(BYTE *)local_b0,(BYTE *)iEnd,&local_f8);
      }
      else {
        uVar11 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_4
                           (ms,(BYTE *)local_b0,(BYTE *)iEnd,&local_f8);
      }
      uVar23 = uVar20;
      if (uVar20 < uVar11) {
        uVar23 = uVar11;
      }
      if (uVar23 < 4) {
        piVar19 = (int *)((long)local_b0 + ((ulong)((long)local_b0 - (long)src) >> 8) + 1);
        ms->lazySkipping = (uint)(0x7ff < (ulong)((long)local_b0 - (long)src));
        uVar8 = local_dc;
      }
      else {
        piVar22 = local_b0;
        uVar24 = local_f8;
        if (uVar11 <= uVar20) {
          piVar22 = (int *)((long)piVar19 + 1);
          uVar24 = 1;
        }
        uVar20 = uVar23;
        if (local_b0 < local_b8) {
          iVar13 = (int)local_b0;
          local_40 = (ulong)(((int)local_60 + iVar13) - local_fc);
          local_48 = (ulong)(((int)local_68 + iVar13) - local_fc);
          local_50 = (ulong)(((int)local_70 + iVar13) - local_fc);
          lVar26 = 0;
          do {
            piVar17 = (int *)((long)local_b0 + lVar26 + 1);
            iVar13 = (int)lVar26;
            uVar8 = (int)local_48 + iVar13 + 1;
            piVar19 = (int *)(local_e8 + uVar8);
            if (uVar8 < (uint)local_c0) {
              piVar19 = (int *)(local_98 + (uint)((int)local_50 + iVar13));
            }
            uVar20 = uVar23;
            if (((uint)((int)local_40 + iVar13) < 0xfffffffd) && (*piVar19 == *piVar17)) {
              mEnd = iEnd;
              if (uVar8 < (uint)local_c0) {
                mEnd = local_a8;
              }
              sVar10 = ZSTD_count_2segments
                                 ((BYTE *)((long)local_b0 + lVar26 + 5),(BYTE *)(piVar19 + 1),
                                  (BYTE *)iEnd,(BYTE *)mEnd,local_a0);
              if (sVar10 < 0xfffffffffffffffc) {
                uVar8 = 0x1f;
                if ((uint)uVar24 != 0) {
                  for (; (uint)uVar24 >> uVar8 == 0; uVar8 = uVar8 - 1) {
                  }
                }
                if ((int)((uVar8 ^ 0x1f) + (int)uVar23 * 3 + -0x1e) < (int)(sVar10 + 4) * 3) {
                  uVar24 = 1;
                  uVar20 = sVar10 + 4;
                  piVar22 = piVar17;
                }
              }
            }
            local_f8 = 999999999;
            if (local_c8 == 6) {
              if (local_ec == 6) {
                uVar23 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_6
                                   (local_d8,(BYTE *)piVar17,(BYTE *)iEnd,&local_f8);
              }
              else if (local_ec == 5) {
                uVar23 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_5
                                   (local_d8,(BYTE *)piVar17,(BYTE *)iEnd,&local_f8);
              }
              else {
                uVar23 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_4
                                   (local_d8,(BYTE *)piVar17,(BYTE *)iEnd,&local_f8);
              }
            }
            else if (local_c8 == 5) {
              if (local_ec == 6) {
                uVar23 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_6
                                   (local_d8,(BYTE *)piVar17,(BYTE *)iEnd,&local_f8);
              }
              else if (local_ec == 5) {
                uVar23 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_5
                                   (local_d8,(BYTE *)piVar17,(BYTE *)iEnd,&local_f8);
              }
              else {
                uVar23 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_4
                                   (local_d8,(BYTE *)piVar17,(BYTE *)iEnd,&local_f8);
              }
            }
            else if (local_ec == 6) {
              uVar23 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_6
                                 (local_d8,(BYTE *)piVar17,(BYTE *)iEnd,&local_f8);
            }
            else if (local_ec == 5) {
              uVar23 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_5
                                 (local_d8,(BYTE *)piVar17,(BYTE *)iEnd,&local_f8);
            }
            else {
              uVar23 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_4
                                 (local_d8,(BYTE *)piVar17,(BYTE *)iEnd,&local_f8);
            }
            if (uVar23 < 4) goto LAB_0017f5e7;
            uVar8 = 0x1f;
            if ((uint)uVar24 != 0) {
              for (; (uint)uVar24 >> uVar8 == 0; uVar8 = uVar8 - 1) {
              }
            }
            iVar13 = 0x1f;
            if ((uint)local_f8 != 0) {
              for (; (uint)local_f8 >> iVar13 == 0; iVar13 = iVar13 + -1) {
              }
            }
            if ((int)uVar23 * 4 - iVar13 <= (int)((uVar8 ^ 0x1f) + (int)uVar20 * 4 + -0x1b))
            goto LAB_0017f5e7;
            lVar6 = lVar26 + 1;
            lVar26 = lVar26 + 1;
            uVar24 = local_f8;
            piVar22 = piVar17;
          } while ((int *)((long)local_b0 + lVar6) < local_b8);
          piVar22 = (int *)((long)local_b0 + lVar26);
          uVar20 = uVar23;
        }
LAB_0017f5e7:
        if (3 < uVar24) {
          uVar11 = (long)piVar22 + (-(long)local_e8 - uVar24) + -0xfffffffd;
          pBVar15 = local_e8;
          pBVar21 = local_a0;
          if ((uint)uVar11 < (uint)local_c0) {
            pBVar15 = local_80;
            pBVar21 = local_58;
          }
          if ((src < piVar22) && (uVar11 = uVar11 & 0xffffffff, pBVar21 < pBVar15 + uVar11)) {
            pBVar15 = pBVar15 + uVar11;
            do {
              piVar19 = (int *)((long)piVar22 + -1);
              pBVar15 = pBVar15 + -1;
              if ((*(BYTE *)piVar19 != *pBVar15) ||
                 (uVar20 = uVar20 + 1, piVar22 = piVar19, piVar19 <= src)) break;
            } while (pBVar21 < pBVar15);
          }
          local_dc = local_fc;
          local_fc = (U32)uVar24 - 3;
        }
        if (local_d0->maxNbSeq <=
            (ulong)((long)local_d0->sequences - (long)local_d0->sequencesStart >> 3)) {
LAB_0017fb5e:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < local_d0->maxNbLit) {
LAB_0017fb3f:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar11 = (long)piVar22 - (long)src;
        pBVar21 = local_d0->lit;
        if (local_d0->litStart + local_d0->maxNbLit < pBVar21 + uVar11) {
LAB_0017fb7d:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468e,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (iEnd < piVar22) {
LAB_0017fb9c:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_78 < piVar22) {
          ZSTD_safecopyLiterals(pBVar21,(BYTE *)src,(BYTE *)piVar22,(BYTE *)local_78);
LAB_0017f6ee:
          local_d0->lit = local_d0->lit + uVar11;
          if (0xffff < uVar11) {
            if (local_d0->longLengthType != ZSTD_llt_none) {
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x46a0,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            local_d0->longLengthType = ZSTD_llt_literalLength;
            local_d0->longLengthPos =
                 (U32)((ulong)((long)local_d0->sequences - (long)local_d0->sequencesStart) >> 3);
          }
        }
        else {
          uVar5 = *(undefined8 *)((long)src + 8);
          *(undefined8 *)pBVar21 = *src;
          *(undefined8 *)(pBVar21 + 8) = uVar5;
          pBVar21 = local_d0->lit;
          if (0x10 < uVar11) {
            if ((BYTE *)0xffffffffffffffe0 < pBVar21 + 0x10 + (-0x10 - ((long)src + 0x10))) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x36a6,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar5 = *(undefined8 *)((long)src + 0x18);
            *(undefined8 *)(pBVar21 + 0x10) = *(undefined8 *)((long)src + 0x10);
            *(undefined8 *)(pBVar21 + 0x18) = uVar5;
            if (0x20 < (long)uVar11) {
              lVar26 = 0;
              do {
                puVar1 = (undefined8 *)((long)src + lVar26 + 0x20);
                uVar5 = puVar1[1];
                pBVar15 = pBVar21 + lVar26 + 0x20;
                *(undefined8 *)pBVar15 = *puVar1;
                *(undefined8 *)(pBVar15 + 8) = uVar5;
                puVar1 = (undefined8 *)((long)src + lVar26 + 0x30);
                uVar5 = puVar1[1];
                *(undefined8 *)(pBVar15 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar15 + 0x18) = uVar5;
                lVar26 = lVar26 + 0x20;
              } while (pBVar15 + 0x20 < pBVar21 + uVar11);
            }
            goto LAB_0017f6ee;
          }
          local_d0->lit = pBVar21 + uVar11;
        }
        psVar18 = local_d0->sequences;
        psVar18->litLength = (U16)uVar11;
        psVar18->offBase = (U32)uVar24;
        if (uVar20 < 3) {
LAB_0017fb20:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46aa,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < uVar20 - 3) {
          if (local_d0->longLengthType != ZSTD_llt_none) {
LAB_0017fbbb:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46ad,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_d0->longLengthType = ZSTD_llt_matchLength;
          local_d0->longLengthPos =
               (U32)((ulong)((long)psVar18 - (long)local_d0->sequencesStart) >> 3);
        }
        psVar18->mlBase = (U16)(uVar20 - 3);
        psVar18 = psVar18 + 1;
        local_d0->sequences = psVar18;
        if (local_d8->lazySkipping != 0) {
          uVar8 = local_d8->nextToUpdate;
          uVar11 = (ulong)uVar8;
          uVar7 = ((int)local_b8 - (int)(local_e8 + uVar11)) + 1;
          if (7 < uVar7) {
            uVar7 = 8;
          }
          if (local_b8 < local_e8 + uVar11) {
            uVar7 = 0;
          }
          if (uVar8 < uVar7 + uVar8) {
            if (0x20 < local_d8->rowHashLog + 8) goto LAB_0017fbda;
            pUVar3 = local_d8->hashTable;
            pBVar21 = local_d8->tagTable;
            uVar23 = local_d8->hashSalt;
            cVar4 = (char)local_d8->rowHashLog;
            do {
              if (local_c8 == 5) {
                uVar24 = *(long *)(local_e8 + uVar11) * -0x30e4432345000000;
LAB_0017f8a7:
                uVar9 = (uint)((uVar24 ^ uVar23) >> (0x38U - cVar4 & 0x3f));
              }
              else {
                if (local_c8 == 6) {
                  uVar24 = *(long *)(local_e8 + uVar11) * -0x30e4432340650000;
                  goto LAB_0017f8a7;
                }
                uVar9 = (*(int *)(local_e8 + uVar11) * -0x61c8864f ^ (uint)uVar23) >>
                        (0x18U - cVar4 & 0x1f);
              }
              uVar16 = (uVar9 >> 8) << ((byte)local_ec & 0x1f);
              if (((ulong)(pUVar3 + uVar16) & 0x3f) != 0) goto LAB_0017fb01;
              if ((local_38 & (ulong)(pBVar21 + uVar16)) != 0) goto LAB_0017fae2;
              local_d8->hashCache[(uint)uVar11 & 7] = uVar9;
              uVar11 = uVar11 + 1;
            } while (uVar7 + uVar8 != uVar11);
          }
          local_d8->lazySkipping = 0;
        }
        piVar19 = (int *)((long)piVar22 + uVar20);
        ms = local_d8;
        src = piVar19;
        uVar8 = local_dc;
        uVar7 = local_dc;
        if (piVar19 <= local_b8) {
          do {
            uVar16 = uVar7;
            uVar7 = local_fc;
            uVar9 = ((int)piVar19 - (int)local_e8) - uVar16;
            pBVar21 = local_e8;
            if (uVar9 < (uint)local_c0) {
              pBVar21 = local_80;
            }
            ms = local_d8;
            src = piVar19;
            uVar8 = uVar16;
            local_fc = uVar7;
            if ((0xfffffffc < uVar9 - (uint)local_c0) || (*(int *)(pBVar21 + uVar9) != *piVar19))
            break;
            piVar22 = iEnd;
            if (uVar9 < (uint)local_c0) {
              piVar22 = local_a8;
            }
            sVar10 = ZSTD_count_2segments
                               ((BYTE *)(piVar19 + 1),(BYTE *)((long)(pBVar21 + uVar9) + 4),
                                (BYTE *)iEnd,(BYTE *)piVar22,local_a0);
            if (local_d0->maxNbSeq <= (ulong)((long)psVar18 - (long)local_d0->sequencesStart >> 3))
            goto LAB_0017fb5e;
            if (0x20000 < local_d0->maxNbLit) goto LAB_0017fb3f;
            pBVar21 = local_d0->lit;
            if (local_d0->litStart + local_d0->maxNbLit < pBVar21) goto LAB_0017fb7d;
            if (iEnd < piVar19) goto LAB_0017fb9c;
            if (local_78 < piVar19) {
              ZSTD_safecopyLiterals(pBVar21,(BYTE *)piVar19,(BYTE *)piVar19,(BYTE *)local_78);
            }
            else {
              uVar5 = *(undefined8 *)(piVar19 + 2);
              *(undefined8 *)pBVar21 = *(undefined8 *)piVar19;
              *(undefined8 *)(pBVar21 + 8) = uVar5;
            }
            psVar18 = local_d0->sequences;
            psVar18->litLength = 0;
            psVar18->offBase = 1;
            if (sVar10 + 4 < 3) goto LAB_0017fb20;
            if (0xffff < sVar10 + 1) {
              if (local_d0->longLengthType != ZSTD_llt_none) goto LAB_0017fbbb;
              local_d0->longLengthType = ZSTD_llt_matchLength;
              local_d0->longLengthPos =
                   (U32)((ulong)((long)psVar18 - (long)local_d0->sequencesStart) >> 3);
            }
            psVar18->mlBase = (U16)(sVar10 + 1);
            psVar18 = psVar18 + 1;
            local_d0->sequences = psVar18;
            piVar19 = (int *)((long)piVar19 + sVar10 + 4);
            ms = local_d8;
            src = piVar19;
            uVar8 = uVar7;
            local_fc = uVar16;
          } while (piVar19 <= local_b8);
        }
      }
      local_dc = uVar8;
    } while (piVar19 < local_b8);
  }
  *local_88 = local_fc;
  local_88[1] = local_dc;
  return (long)iEnd - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_lazy_dedicatedDictSearch_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 1, ZSTD_dedicatedDictSearch);
}